

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void exchange_particle_slices
               (int send_left,int send_width,int receive_left,int receive_width,int rank,
               vector<int,_std::allocator<int>_> *particle_numbers,int pn_size,
               vector<particle,_std::allocator<particle>_> *particles,int x_diff)

{
  int iVar1;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar2;
  undefined8 in_stack_ffffffffffffffa0;
  uint uVar3;
  int particles_to_receive;
  int particles_to_send;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  uVar3 = (uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  particles_to_send = pack_particle_slice(send_left,send_width,particle_numbers,particles);
  particles_to_receive = 0;
  MPI_Sendrecv(&particles_to_send,1,&ompi_mpi_int,rank,0,&particles_to_receive,1,&ompi_mpi_int,
               CONCAT44(uVar2,rank),(ulong)uVar3 << 0x20,&ompi_mpi_comm_world,0);
  if ((int)(((long)(particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
                  super__Vector_impl_data._M_start) / 0x68) < particles_to_receive) {
    std::vector<particle,_std::allocator<particle>_>::resize
              (particles,(long)((particles_to_receive * 3) / 2 + 1));
  }
  MPI_Sendrecv_replace
            ((particle_numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,pn_size,&ompi_mpi_int,rank,1,rank,1,
             &ompi_mpi_comm_world,0);
  iVar1 = particles_to_send;
  if (particles_to_send < particles_to_receive) {
    iVar1 = particles_to_receive;
  }
  MPI_Sendrecv_replace
            ((particles->super__Vector_base<particle,_std::allocator<particle>_>)._M_impl.
             super__Vector_impl_data._M_start,iVar1,MPI_PARTICLE,rank,2,rank,2,&ompi_mpi_comm_world,
             0);
  unpack_particle_slice(receive_left,receive_width,particle_numbers,particles,x_diff);
  return;
}

Assistant:

void exchange_particle_slices(int send_left, int send_width, int receive_left, int receive_width, int rank,
        vector<int> & particle_numbers, int pn_size, vector<particle> & particles, int x_diff) {
    int particles_to_send = pack_particle_slice(send_left, send_width, particle_numbers, particles);
    int particles_to_receive = 0;

    MPI_Sendrecv(&particles_to_send, 1, MPI_INT, rank, 0, &particles_to_receive, 1, MPI_INT, rank, 0, MPI_COMM_WORLD,
            MPI_STATUS_IGNORE);

    if (particles_to_receive > static_cast<int>(particles.size())) {
        particles.resize(3 * particles_to_receive / 2 + 1);
    }

    MPI_Sendrecv_replace(&(particle_numbers[0]), pn_size, MPI_INT, rank, 1, rank, 1, MPI_COMM_WORLD,
    MPI_STATUSES_IGNORE);

    int particles_size = max(particles_to_receive, particles_to_send);

    MPI_Sendrecv_replace(&(particles[0]), particles_size, MPI_PARTICLE, rank, 2, rank, 2, MPI_COMM_WORLD,
            MPI_STATUS_IGNORE);

    unpack_particle_slice(receive_left, receive_width, particle_numbers, particles, x_diff);
}